

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

void append_entry_w(wchar_t **wp,wchar_t *prefix,wchar_t tag,wchar_t *wname,wchar_t perm,wchar_t id)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  wchar_t wVar4;
  int *__src;
  wchar_t *pwVar5;
  ulong uVar6;
  
  if (prefix != (wchar_t *)0x0) {
    wcscpy(*wp,prefix);
    pwVar5 = *wp;
    sVar3 = wcslen(pwVar5);
    *wp = pwVar5 + sVar3;
  }
  __src = anon_var_dwarf_659c6;
  switch(tag) {
  case L'✑':
    goto switchD_001559c5_caseD_2711;
  case L'✒':
    break;
  case L'✓':
    __src = anon_var_dwarf_659dd;
    goto switchD_001559c5_caseD_2711;
  case L'✔':
    __src = anon_var_dwarf_659dd;
    break;
  case L'✕':
    __src = anon_var_dwarf_659ff;
    break;
  case L'✖':
    __src = anon_var_dwarf_659f4;
    break;
  default:
    goto switchD_001559c5_default;
  }
  id = L'\xffffffff';
  wname = (wchar_t *)0x0;
switchD_001559c5_caseD_2711:
  wcscpy(*wp,__src);
switchD_001559c5_default:
  pwVar5 = *wp;
  sVar3 = wcslen(pwVar5);
  pwVar5 = pwVar5 + sVar3 + 1;
  *wp = pwVar5;
  pwVar5[-1] = L':';
  if (wname == (wchar_t *)0x0) {
    if ((tag & 0xfffffffdU) == 0x2711) {
      append_id_w(wp,id);
      id = L'\xffffffff';
    }
  }
  else {
    wcscpy(pwVar5,wname);
    pwVar5 = *wp;
    sVar3 = wcslen(pwVar5);
    *wp = pwVar5 + sVar3;
  }
  pwVar5 = *wp;
  *wp = pwVar5 + 1;
  *pwVar5 = L':';
  uVar6 = CONCAT44(-(uint)((perm & 0x92U) == 0),-(uint)((perm & 0x124U) == 0));
  uVar2 = (ulong)DAT_00171fb0;
  uVar1 = (ulong)DAT_00171fc0;
  *wp = pwVar5 + 3;
  *(ulong *)(pwVar5 + 1) = uVar6 & uVar1 | ~uVar6 & uVar2;
  wVar4 = L'x';
  if ((perm & 0x49U) == 0) {
    wVar4 = L'-';
  }
  *wp = pwVar5 + 4;
  pwVar5[3] = wVar4;
  if (id != L'\xffffffff') {
    *wp = pwVar5 + 5;
    pwVar5[4] = L':';
    append_id_w(wp,id);
  }
  **wp = L'\0';
  return;
}

Assistant:

static void
append_entry_w(wchar_t **wp, const wchar_t *prefix, int tag,
    const wchar_t *wname, int perm, int id)
{
	if (prefix != NULL) {
		wcscpy(*wp, prefix);
		*wp += wcslen(*wp);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		wname = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		wcscpy(*wp, L"user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		wname = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		wcscpy(*wp, L"group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		wcscpy(*wp, L"mask");
		wname = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		wcscpy(*wp, L"other");
		wname = NULL;
		id = -1;
		break;
	}
	*wp += wcslen(*wp);
	*(*wp)++ = L':';
	if (wname != NULL) {
		wcscpy(*wp, wname);
		*wp += wcslen(*wp);
	} else if (tag == ARCHIVE_ENTRY_ACL_USER
	    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
		append_id_w(wp, id);
		id = -1;
	}
	*(*wp)++ = L':';
	*(*wp)++ = (perm & 0444) ? L'r' : L'-';
	*(*wp)++ = (perm & 0222) ? L'w' : L'-';
	*(*wp)++ = (perm & 0111) ? L'x' : L'-';
	if (id != -1) {
		*(*wp)++ = L':';
		append_id_w(wp, id);
	}
	**wp = L'\0';
}